

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

http_protocol_version_t find_http_protocol_version(char *sval)

{
  int iVar1;
  int local_20;
  http_protocol_version_t local_1c;
  int i;
  http_protocol_version_t result;
  char *sval_local;
  
  local_1c = HTTP10;
  local_20 = 0;
  while( true ) {
    if (http_protocol_version[local_20] == (char *)0x0) {
      return INVALID_PROTO;
    }
    iVar1 = strncmp(sval,http_protocol_version[local_20],0x10);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
    local_1c = local_1c + HTTP11;
  }
  return local_1c;
}

Assistant:

http_protocol_version_t find_http_protocol_version(const char *sval)
{
  http_protocol_version_t result = HTTP10; /* value corresponding to etable[0] */
  int i = 0;
  for (i = 0; http_protocol_version[i] != NULL; ++i, ++result)
    if (!(strncmp(sval, http_protocol_version[i], 16)))
      return result;
  return INVALID_PROTO;
}